

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextOutput::beginStep(AspifTextOutput *this)

{
  ostream *poVar1;
  
  if (-1 < this->step_) {
    if (this->step_ == 0) {
      std::operator<<(this->os_,"% #program base.\n");
    }
    else {
      poVar1 = std::operator<<(this->os_,"% #program step(");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->step_);
      std::operator<<(poVar1,").\n");
      TheoryData::update(&this->theory_);
    }
    this->step_ = this->step_ + 1;
    this->startAtom_ =
         (Atom_t)((ulong)((long)(this->data_->atoms).
                                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->data_->atoms).
                               super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return;
}

Assistant:

void AspifTextOutput::beginStep() {
	if (step_ >= 0) {
		if (step_) { os_ << "% #program step(" << step_ << ").\n"; theory_.update(); }
		else       { os_ << "% #program base.\n"; }
		++step_;
		startAtom_ = data_->atoms.size();
	}
}